

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LogicalOrLayerParams::~LogicalOrLayerParams(LogicalOrLayerParams *this)

{
  ~LogicalOrLayerParams(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

LogicalOrLayerParams::~LogicalOrLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.LogicalOrLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}